

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O3

void __thiscall
Ptex::v2_4::PtexReader::TiledFaceBase::getPixel(TiledFaceBase *this,int ui,int vi,void *result)

{
  int iVar1;
  undefined4 extraout_var;
  int iVar3;
  int iVar4;
  long *plVar2;
  
  iVar3 = ui >> ((this->_tileres).ulog2 & 0x1fU);
  iVar4 = vi >> ((this->_tileres).vlog2 & 0x1fU);
  iVar1 = (*(this->super_FaceData).super_PtexFaceData._vptr_PtexFaceData[9])
                    (this,(ulong)(uint)(this->_ntilesu * iVar4 + iVar3));
  plVar2 = (long *)CONCAT44(extraout_var,iVar1);
  (**(code **)(*plVar2 + 0x28))
            (plVar2,ui - (iVar3 << ((this->_tileres).ulog2 & 0x1fU)),
             vi - (iVar4 << ((this->_tileres).vlog2 & 0x1fU)),result);
  (**(code **)(*plVar2 + 0x10))(plVar2);
  return;
}

Assistant:

void PtexReader::TiledFaceBase::getPixel(int ui, int vi, void* result)
{
    int tileu = ui >> _tileres.ulog2;
    int tilev = vi >> _tileres.vlog2;
    PtexPtr<PtexFaceData> tile ( getTile(tilev * _ntilesu + tileu) );
    tile->getPixel(ui - (tileu<<_tileres.ulog2),
                   vi - (tilev<<_tileres.vlog2), result);
}